

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  cmMakefile *pcVar4;
  cmLocalGenerator *this_01;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  cmState *this_02;
  cmOrderDirectories *pcVar7;
  ulong uVar8;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  allocator local_2e1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  undefined1 local_228 [8];
  string var;
  undefined1 local_200 [8];
  string rlVar;
  string local_1d8;
  undefined1 local_1b8 [8];
  string rtSepVar;
  undefined1 local_190 [8];
  string rtVar;
  char *tType;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  undefined1 local_e8 [8];
  string loader_flag_var;
  string local_c0;
  allocator local_99;
  string local_98;
  string local_78;
  allocator local_51;
  string local_50;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmComputeLinkInformation *this_local;
  
  local_20 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  vector(&this->Items);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FrameworkPaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RuntimeSearchPath);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->SharedLibrariesLinked);
  std::__cxx11::string::string((string *)&this->Config);
  std::__cxx11::string::string((string *)&this->LinkLanguage);
  std::__cxx11::string::string((string *)&this->LibLinkFlag);
  std::__cxx11::string::string((string *)&this->LibLinkFileFlag);
  std::__cxx11::string::string((string *)&this->LibLinkSuffix);
  std::__cxx11::string::string((string *)&this->RuntimeFlag);
  std::__cxx11::string::string((string *)&this->RuntimeSep);
  std::__cxx11::string::string((string *)&this->RuntimeAlways);
  std::__cxx11::string::string((string *)&this->RPathLinkFlag);
  std::__cxx11::string::string((string *)&this->StaticLinkTypeFlag);
  std::__cxx11::string::string((string *)&this->SharedLinkTypeFlag);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->StaticLinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SharedLinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkExtensions);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->LinkPrefixes);
  cmsys::RegularExpression::RegularExpression(&this->ExtractStaticLibraryName);
  cmsys::RegularExpression::RegularExpression(&this->ExtractSharedLibraryName);
  cmsys::RegularExpression::RegularExpression(&this->ExtractAnyLibraryName);
  std::__cxx11::string::string((string *)&this->SharedRegexString);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->FrameworkPathsEmmitted);
  cmsys::RegularExpression::RegularExpression(&this->SplitFramework);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ImplicitLinkDirs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ImplicitLinkLibs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RuntimeLinkDirs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->OldLinkDirMask);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OldLinkDirItems);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OldUserFlagItems);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->CMP0060WarnItems);
  this->Target = (cmGeneratorTarget *)config_local;
  pcVar4 = cmTarget::GetMakefile(this->Target->Target);
  this->Makefile = pcVar4;
  this_01 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this_01);
  this->GlobalGenerator = pcVar5;
  pcVar6 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  this->CMakeInstance = pcVar6;
  this_02 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",&local_51);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_02,&local_50);
  this->OpenBSD = bVar1;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator=((string *)&this->Config,(string *)local_20);
  pcVar7 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories
            (pcVar7,this->GlobalGenerator,(cmGeneratorTarget *)config_local,"linker search path");
  this->OrderLinkerSearchPath = pcVar7;
  pcVar7 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories
            (pcVar7,this->GlobalGenerator,(cmGeneratorTarget *)config_local,"runtime search path");
  this->OrderRuntimeSearchPath = pcVar7;
  this->OrderDependentRPath = (cmOrderDirectories *)0x0;
  cmGeneratorTarget::GetLinkerLanguage(&local_78,this->Target,local_20);
  std::__cxx11::string::operator=((string *)&this->LinkLanguage,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_99);
    pcVar9 = cmMakefile::GetDefinition(pcVar4,&local_98);
    this->UseImportLibrary = pcVar9 != (char *)0x0;
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    this_00 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,"LINK_DEPENDS_NO_SHARED",
               (allocator *)(loader_flag_var.field_2._M_local_buf + 0xf));
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_c0);
    this->LinkDependsNoShared = bVar1;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(loader_flag_var.field_2._M_local_buf + 0xf));
    this->LoaderFlag = (char *)0x0;
    if (((this->UseImportLibrary & 1U) == 0) &&
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_e8,"CMAKE_SHARED_MODULE_LOADER_",&local_e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::operator+=((string *)local_e8,(string *)&this->LinkLanguage);
      std::__cxx11::string::operator+=((string *)local_e8,"_FLAG");
      pcVar9 = cmMakefile::GetDefinition(this->Makefile,(string *)local_e8);
      this->LoaderFlag = pcVar9;
      std::__cxx11::string::~string((string *)local_e8);
    }
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"CMAKE_LINK_LIBRARY_FLAG",&local_111);
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_110);
    std::__cxx11::string::operator=((string *)&this->LibLinkFlag,pcVar9);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"CMAKE_LINK_LIBRARY_FILE_FLAG",&local_139);
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_138);
    std::__cxx11::string::operator=((string *)&this->LibLinkFileFlag,pcVar9);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_160,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator *)((long)&tType + 7));
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_160);
    std::__cxx11::string::operator=((string *)&this->LibLinkSuffix,pcVar9);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tType + 7));
    this->RuntimeUseChrpath = false;
    TVar2 = cmGeneratorTarget::GetType(this->Target);
    if (TVar2 != STATIC_LIBRARY) {
      TVar2 = cmGeneratorTarget::GetType(this->Target);
      rtVar.field_2._8_8_ = "SHARED_LIBRARY";
      if (TVar2 == EXECUTABLE) {
        rtVar.field_2._8_8_ = "EXECUTABLE";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_190,"CMAKE_",(allocator *)(rtSepVar.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(rtSepVar.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_190,(char *)rtVar.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_190,"_RUNTIME_");
      std::__cxx11::string::operator+=((string *)local_190,(string *)&this->LinkLanguage);
      std::__cxx11::string::operator+=((string *)local_190,"_FLAG");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "_SEP");
      pcVar9 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_190);
      std::__cxx11::string::operator=((string *)&this->RuntimeFlag,pcVar9);
      pcVar9 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1b8);
      std::__cxx11::string::operator=((string *)&this->RuntimeSep,pcVar9);
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d8,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH",
                 (allocator *)(rlVar.field_2._M_local_buf + 0xf));
      pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_1d8);
      std::__cxx11::string::operator=((string *)&this->RuntimeAlways,pcVar9);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)(rlVar.field_2._M_local_buf + 0xf));
      bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,local_20);
      this->RuntimeUseChrpath = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_200,"CMAKE_",(allocator *)(var.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(var.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_200,(char *)rtVar.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_200,"_RPATH_LINK_");
      std::__cxx11::string::operator+=((string *)local_200,(string *)&this->LinkLanguage);
      std::__cxx11::string::operator+=((string *)local_200,"_FLAG");
      pcVar9 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_200);
      std::__cxx11::string::operator=((string *)&this->RPathLinkFlag,pcVar9);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)local_190);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_228,"CMAKE_SHARED_LIBRARY_LINK_",&local_229);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::__cxx11::string::operator+=((string *)local_228,(string *)&this->LinkLanguage);
    std::__cxx11::string::operator+=((string *)local_228,"_WITH_RUNTIME_PATH");
    bVar1 = cmMakefile::IsOn(this->Makefile,(string *)local_228);
    this->LinkWithRuntimePath = bVar1;
    std::__cxx11::string::~string((string *)local_228);
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_250,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME",&local_251);
    bVar1 = cmMakefile::IsOn(pcVar4,&local_250);
    this->NoSONameUsesPath = bVar1;
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_278,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES",&local_279);
    bVar1 = cmMakefile::IsOn(pcVar4,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    if (bVar1) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2a0,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS",
                 (allocator *)((long)&dirs + 7));
      bVar1 = cmMakefile::IsOn(pcVar4,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dirs + 7));
      if (bVar1) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          this->SharedDependencyMode = SharedDepModeDir;
          pcVar7 = (cmOrderDirectories *)operator_new(0x2d0);
          cmOrderDirectories::cmOrderDirectories
                    (pcVar7,this->GlobalGenerator,(cmGeneratorTarget *)config_local,
                     "dependent library path");
          this->OrderDependentRPath = pcVar7;
        }
      }
    }
    pcVar7 = this->OrderLinkerSearchPath;
    pvVar10 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
    cmOrderDirectories::AddUserDirectories(pcVar7,pvVar10);
    pcVar7 = this->OrderRuntimeSearchPath;
    pvVar10 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
    cmOrderDirectories::AddUserDirectories(pcVar7,pvVar10);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories(this->OrderLinkerSearchPath,&this->ImplicitLinkDirs);
    cmOrderDirectories::SetImplicitDirectories(this->OrderRuntimeSearchPath,&this->ImplicitLinkDirs)
    ;
    if (this->OrderDependentRPath != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(this->OrderDependentRPath,&this->ImplicitLinkDirs);
      cmOrderDirectories::AddLanguageDirectories(this->OrderDependentRPath,&this->RuntimeLinkDirs);
    }
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0003(this->Target);
    this->OldLinkDirMode = PVar3 != NEW;
    if ((this->OldLinkDirMode & 1U) != 0) {
      local_2b0 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
      local_2b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_2b0);
      local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(local_2b0);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->OldLinkDirMask,local_2b8,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_2c0);
    }
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"CMAKE_POLICY_WARNING_CMP0060",&local_2e1);
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(pcVar4,&local_2e0);
    this->CMP0060Warn = bVar1;
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  }
  return;
}

Assistant:

cmComputeLinkInformation
::cmComputeLinkInformation(const cmGeneratorTarget* target,
                           const std::string& config)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
      this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();

  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()
            ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // The configuration being linked.
  this->Config = config;

  // Allocate internals.
  this->OrderLinkerSearchPath =
    new cmOrderDirectories(this->GlobalGenerator, target,
                           "linker search path");
  this->OrderRuntimeSearchPath =
    new cmOrderDirectories(this->GlobalGenerator, target,
                           "runtime search path");
  this->OrderDependentRPath = 0;

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if(this->LinkLanguage.empty())
    {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
    }

  // Check whether we should use an import library for linking a target.
  this->UseImportLibrary =
    this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")?true:false;

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  this->LoaderFlag = 0;
  if(!this->UseImportLibrary &&
     this->Target->GetType() == cmState::MODULE_LIBRARY)
    {
    std::string loader_flag_var = "CMAKE_SHARED_MODULE_LOADER_";
    loader_flag_var += this->LinkLanguage;
    loader_flag_var += "_FLAG";
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
    }

  // Get options needed to link libraries.
  this->LibLinkFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  this->LibLinkFileFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  this->LibLinkSuffix =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if(this->Target->GetType() != cmState::STATIC_LIBRARY)
    {
    const char* tType =
      ((this->Target->GetType() == cmState::EXECUTABLE)?
       "EXECUTABLE" : "SHARED_LIBRARY");
    std::string rtVar = "CMAKE_";
    rtVar += tType;
    rtVar += "_RUNTIME_";
    rtVar += this->LinkLanguage;
    rtVar += "_FLAG";
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways =
      (this->Makefile->
       GetSafeDefinition("CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar = "CMAKE_";
    rlVar += tType;
    rlVar += "_RPATH_LINK_";
    rlVar += this->LinkLanguage;
    rlVar += "_FLAG";
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
    }

  // Check if we need to include the runtime search path at link time.
  {
  std::string var = "CMAKE_SHARED_LIBRARY_LINK_";
  var += this->LinkLanguage;
  var += "_WITH_RUNTIME_PATH";
  this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if(this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES"))
    {
    this->SharedDependencyMode = SharedDepModeLink;
    }
  else if(this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS"))
    {
    this->SharedDependencyMode = SharedDepModeLibDir;
    }
  else if(!this->RPathLinkFlag.empty())
    {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath =
      new cmOrderDirectories(this->GlobalGenerator, target,
                             "dependent library path");
    }

  // Add the search path entries requested by the user to path ordering.
  this->OrderLinkerSearchPath
    ->AddUserDirectories(this->Target->GetLinkDirectories());
  this->OrderRuntimeSearchPath
    ->AddUserDirectories(this->Target->GetLinkDirectories());

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath
    ->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath
    ->SetImplicitDirectories(this->ImplicitLinkDirs);
  if(this->OrderDependentRPath)
    {
    this->OrderDependentRPath
      ->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath
      ->AddLanguageDirectories(this->RuntimeLinkDirs);
    }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if(this->OldLinkDirMode)
    {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    std::vector<std::string> const& dirs =
        this->Target->GetLinkDirectories();
    this->OldLinkDirMask.insert(dirs.begin(), dirs.end());
    }

  this->CMP0060Warn =
    this->Makefile->PolicyOptionalWarningEnabled(
      "CMAKE_POLICY_WARNING_CMP0060");
}